

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

void peparse::IterImpVAString(parsed_pe_conflict *pe,iterVAStr cb,void *cbd)

{
  VA VVar1;
  int iVar2;
  _List_node_base *p_Var3;
  list<peparse::importent,_std::allocator<peparse::importent>_> *plVar4;
  importent i;
  string local_70;
  string local_50;
  
  plVar4 = &pe->internal->imports;
  p_Var3 = (_List_node_base *)plVar4;
  do {
    p_Var3 = (((_List_base<peparse::importent,_std::allocator<peparse::importent>_> *)
              &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)plVar4) {
      return;
    }
    VVar1 = (VA)p_Var3[1]._M_next;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,p_Var3[1]._M_prev,
               (long)&(p_Var3[1]._M_prev)->_M_next + (long)p_Var3[2]._M_next);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,p_Var3[3]._M_prev,
               (long)&(p_Var3[3]._M_prev)->_M_next + (long)p_Var3[4]._M_next);
    iVar2 = (*cb)(cbd,VVar1,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  } while (iVar2 == 0);
  return;
}

Assistant:

void IterImpVAString(parsed_pe *pe, iterVAStr cb, void *cbd) {
  list<importent> &l = pe->internal->imports;

  for (importent i : l) {
    if (cb(cbd, i.addr, i.moduleName, i.symbolName) != 0) {
      break;
    }
  }

  return;
}